

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_hex
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  char *digits;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  ptrdiff_t _Num;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar13;
  write_int_data<char> local_40;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  lVar11 = 0;
  uVar5 = this->abs_value;
  do {
    lVar11 = lVar11 + 1;
    bVar4 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar4);
  pbVar13 = (this->out).container;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar11,prefix,specs);
  uVar5 = (ulong)specs->width;
  if (-1 < (long)uVar5) {
    uVar12 = 0;
    if (local_40.size <= uVar5) {
      uVar12 = uVar5 - local_40.size;
    }
    uVar5 = uVar12 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar3 = pbVar13->size_;
    uVar9 = local_40.size + sVar3 + (specs->fill).size_ * uVar12;
    if (pbVar13->capacity_ < uVar9) {
      (**pbVar13->_vptr_buffer)(pbVar13,uVar9);
    }
    pbVar13->size_ = uVar9;
    pcVar6 = fill<char*,char>(pbVar13->ptr_ + sVar3,uVar5,&specs->fill);
    if (uVar7 != 0) {
      memmove(pcVar6,this->prefix,uVar7);
      pcVar6 = pcVar6 + uVar7;
    }
    pcVar10 = pcVar6;
    if (local_40.padding != 0) {
      pcVar10 = pcVar6 + local_40.padding;
      memset(pcVar6,0x30,local_40.padding);
    }
    pcVar6 = "0123456789ABCDEF";
    if (this->specs->type == 'x') {
      pcVar6 = "0123456789abcdef";
    }
    pcVar8 = pcVar10 + lVar11;
    uVar7 = this->abs_value;
    do {
      pcVar8 = pcVar8 + -1;
      *pcVar8 = pcVar6[(uint)uVar7 & 0xf];
      bVar4 = 0xf < uVar7;
      uVar7 = uVar7 >> 4;
    } while (bVar4);
    fill<char*,char>(pcVar10 + lVar11,uVar12 - uVar5,&specs->fill);
    (this->out).container = pbVar13;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }